

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar1;
  date_t input_00;
  date_t input_01;
  reference pvVar2;
  timestamp_t value;
  timestamp_t value_00;
  BaseStatistics result;
  Value min_value;
  Value max_value;
  LogicalType LStack_118;
  BaseStatistics local_100;
  Value local_a8;
  Value local_68;
  
  this_00 = input->child_stats;
  pvVar2 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,1);
  bVar1 = NumericStats::HasMinMax(pvVar2);
  if (bVar1) {
    input_00 = NumericStats::GetMin<duckdb::date_t>(pvVar2);
    input_01 = NumericStats::GetMax<duckdb::date_t>(pvVar2);
    if (input_00.days <= input_01.days) {
      value = DateTrunc::
              UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>
                        (input_00);
      value_00 = DateTrunc::
                 UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>
                           (input_01);
      Value::CreateValue<duckdb::timestamp_t>(&local_a8,value);
      Value::CreateValue<duckdb::timestamp_t>(&local_68,value_00);
      LogicalType::LogicalType(&LStack_118,&local_a8.type_);
      NumericStats::CreateEmpty(&local_100,&LStack_118);
      LogicalType::~LogicalType(&LStack_118);
      NumericStats::SetMin(&local_100,&local_a8);
      NumericStats::SetMax(&local_100,&local_68);
      pvVar2 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
      BaseStatistics::CopyValidity(&local_100,pvVar2);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&local_100);
      Value::~Value(&local_68);
      Value::~Value(&local_a8);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}